

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

namespace_t * __thiscall
cs_impl::any::holder<std::shared_ptr<cs::name_space>_>::get_ext
          (holder<std::shared_ptr<cs::name_space>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  string local_90;
  undefined5 *local_70;
  long local_68;
  undefined5 local_60;
  undefined3 uStack_5b;
  undefined5 uStack_58;
  undefined1 local_53;
  string local_50;
  
  auVar7 = __cxa_allocate_exception(0x28);
  local_60 = 0x6567726154;
  uStack_5b = 0x742074;
  uStack_58 = 0x2220657079;
  local_68 = 0xd;
  local_53 = 0;
  local_70 = &local_60;
  cxx_demangle_abi_cxx11_(&local_90,(cs_impl *)"cs::namespace",auVar7._8_8_);
  uVar5 = 0xf;
  if (local_70 != &local_60) {
    uVar5 = CONCAT35(uStack_5b,local_60);
  }
  if (uVar5 < local_90._M_string_length + local_68) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar6 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_68 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00188abf;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
LAB_00188abf:
  local_b0 = (undefined8 *)*puVar2;
  puVar1 = puVar2 + 2;
  if (local_b0 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar1;
  }
  local_a8 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_50._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar3[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  cs::runtime_error::runtime_error(auVar7._0_8_,&local_50);
  __cxa_throw(auVar7._0_8_,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

static cs::namespace_t &get_ext()
	{
		throw cs::runtime_error(std::string("Target type \"") + cs_impl::cxx_demangle(cs_impl::get_name_of_type<T>()) +
		                        "\" doesn't have extension field.");
	}